

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_.cxx
# Opt level: O0

void __thiscall Fl_Input_::Fl_Input_(Fl_Input_ *this,int X,int Y,int W,int H,char *l)

{
  char *l_local;
  int H_local;
  int W_local;
  int Y_local;
  int X_local;
  Fl_Input_ *this_local;
  
  Fl_Widget::Fl_Widget(&this->super_Fl_Widget,X,Y,W,H,l);
  (this->super_Fl_Widget)._vptr_Fl_Widget = (_func_int **)&PTR__Fl_Input__002ec8f0;
  Fl_Widget::box(&this->super_Fl_Widget,FL_DOWN_BOX);
  Fl_Widget::color(&this->super_Fl_Widget,7,0xf);
  Fl_Widget::align(&this->super_Fl_Widget,4);
  this->textsize_ = FL_NORMAL_SIZE;
  this->textfont_ = 0;
  this->textcolor_ = 0;
  this->cursor_color_ = 0;
  this->size_ = 0;
  this->position_ = 0;
  this->mark_ = 0;
  this->bufsize = 0;
  this->buffer = (char *)0x0;
  this->value_ = "";
  this->yscroll_ = 0;
  this->xscroll_ = 0;
  this->maximum_size_ = 0x7fff;
  this->shortcut_ = 0;
  Fl_Widget::set_flag(&this->super_Fl_Widget,0x40);
  Fl_Widget::set_flag(&this->super_Fl_Widget,0x80000);
  tab_nav(this,1);
  return;
}

Assistant:

Fl_Input_::Fl_Input_(int X, int Y, int W, int H, const char* l)
: Fl_Widget(X, Y, W, H, l) {
  box(FL_DOWN_BOX);
  color(FL_BACKGROUND2_COLOR, FL_SELECTION_COLOR);
  align(FL_ALIGN_LEFT);
  textsize_ = FL_NORMAL_SIZE;
  textfont_ = FL_HELVETICA;
  textcolor_ = FL_FOREGROUND_COLOR;
  cursor_color_ = FL_FOREGROUND_COLOR; // was FL_BLUE
  mark_ = position_ = size_ = 0;
  bufsize = 0;
  buffer  = 0;
  value_ = "";
  xscroll_ = yscroll_ = 0;
  maximum_size_ = 32767;
  shortcut_ = 0;
  set_flag(SHORTCUT_LABEL);
  set_flag(MAC_USE_ACCENTS_MENU);
  tab_nav(1);
}